

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void __thiscall tinygltf::Sampler::Sampler(Sampler *this,Sampler *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->name)._M_dataplus._M_p;
  paVar7 = &(param_1->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_1->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar3;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar2;
    (this->name).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->name)._M_string_length = (param_1->name)._M_string_length;
  (param_1->name)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->name)._M_string_length = 0;
  (param_1->name).field_2._M_local_buf[0] = '\0';
  iVar4 = param_1->magFilter;
  iVar5 = param_1->wrapS;
  iVar6 = param_1->wrapT;
  this->minFilter = param_1->minFilter;
  this->magFilter = iVar4;
  this->wrapS = iVar5;
  this->wrapT = iVar6;
  Value::Value(&this->extras,&param_1->extras);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  paVar1 = &(this->extras_json_string).field_2;
  (this->extras_json_string)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->extras_json_string)._M_dataplus._M_p;
  paVar7 = &(param_1->extras_json_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_1->extras_json_string).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->extras_json_string).field_2 + 8) = uVar3;
  }
  else {
    (this->extras_json_string)._M_dataplus._M_p = pcVar2;
    (this->extras_json_string).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->extras_json_string)._M_string_length = (param_1->extras_json_string)._M_string_length;
  (param_1->extras_json_string)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->extras_json_string)._M_string_length = 0;
  (param_1->extras_json_string).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->extensions_json_string).field_2;
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->extensions_json_string)._M_dataplus._M_p;
  paVar7 = &(param_1->extensions_json_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&(param_1->extensions_json_string).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->extensions_json_string).field_2 + 8) = uVar3;
  }
  else {
    (this->extensions_json_string)._M_dataplus._M_p = pcVar2;
    (this->extensions_json_string).field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  (this->extensions_json_string)._M_string_length =
       (param_1->extensions_json_string)._M_string_length;
  (param_1->extensions_json_string)._M_dataplus._M_p = (pointer)paVar7;
  (param_1->extensions_json_string)._M_string_length = 0;
  (param_1->extensions_json_string).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Sampler() = default;